

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FrexpCaseInstance::compare
          (FrexpCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  pointer pSVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  ostringstream *this_00;
  long lVar12;
  deUint32 u32;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)*(uint *)((long)&(pSVar2->varType).m_data + 4);
  iVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar5 = iVar3 < 1;
  if (0 < iVar3) {
    fVar11 = (float)~(-1 << (0x17 - (&DAT_00b5844c)[uVar6 * 4] & 0x1f));
    lVar12 = 0;
    do {
      fVar1 = *(float *)((long)*inputs + lVar12 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar8 = (float)((uint)fVar1 & 0x807fffff | 0x3f000000);
        iVar9 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7e;
        iVar7 = iVar9;
        if (((uint)fVar1 & 0x7fffff) != 0) {
          iVar7 = -0x7d;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar7 = iVar9;
        }
      }
      else {
        fVar8 = (float)((uint)fVar1 & 0x80000000);
        iVar7 = 0;
      }
      fVar1 = *(float *)((long)*outputs + lVar12 * 4);
      if (uVar6 == 2 && (this->super_CommonFunctionTestInstance).m_shaderType != SHADERTYPE_FRAGMENT
         ) {
LAB_0083aa1a:
        fVar10 = (float)((int)fVar8 - (int)fVar1);
        if ((uint)fVar8 < (uint)fVar1) {
          fVar10 = (float)-((int)fVar8 - (int)fVar1);
        }
      }
      else if ((fVar1 != 0.0) || (NAN(fVar1))) {
        if ((fVar8 != 0.0) || (NAN(fVar8))) goto LAB_0083aa1a;
        fVar10 = ABS(fVar1);
      }
      else {
        fVar10 = ABS(fVar8);
      }
      if (((uint)fVar11 < (uint)fVar10) || (*(int *)((long)outputs[1] + lVar12 * 4) != iVar7)) {
        this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar4 = (ostream *)std::ostream::operator<<(this_00,(int)lVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
        local_34.value = fVar8;
        poVar4 = anon_unknown_0::operator<<(poVar4,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," with ULP threshold ",0x14);
        local_40.value = (deUint64)(uint)fVar11;
        poVar4 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar10;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar4);
        return bVar5;
      }
      lVar12 = lVar12 + 1;
      bVar5 = iVar3 <= (int)lVar12;
    } while (iVar3 != (int)lVar12);
  }
  return bVar5;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				transitSupportsSignedZero	= (m_shaderType != glu::SHADERTYPE_FRAGMENT); // executor cannot reliably transit negative zero to fragment stage
		const bool				signedZero					= supportsSignedZero(precision) && transitSupportsSignedZero;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}